

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O2

int run_test_we_get_signals(void)

{
  int iVar1;
  uv_loop_t *loop;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc [2];
  signal_ctx sc [4];
  
  loop = (uv_loop_t *)uv_default_loop();
  start_watcher(loop,10,sc,0);
  start_watcher(loop,10,sc + 1,0);
  start_watcher(loop,0xc,sc + 2,0);
  start_watcher(loop,0xc,sc + 3,0);
  start_timer(loop,10,tc);
  start_timer(loop,0xc,tc + 1);
  iVar1 = uv_run(loop,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    for (lVar2 = 4; lVar2 != 0x224; lVar2 = lVar2 + 0x88) {
      eval_a = (int64_t)*(uint *)((long)&sc[0].stop_or_close + lVar2);
      eval_b = 10;
      if (eval_a != 10) {
        pcVar5 = "10";
        pcVar4 = "sc[i].ncalls";
        uVar3 = 0xcf;
        goto LAB_00173b69;
      }
    }
    for (lVar2 = 0; lVar2 != 0x110; lVar2 = lVar2 + 0x88) {
      eval_a = (int64_t)*(uint *)((long)&tc[0].ncalls + lVar2);
      eval_b = 10;
      if (eval_a != 10) {
        pcVar5 = "10";
        pcVar4 = "tc[i].ncalls";
        uVar3 = 0xd2;
        goto LAB_00173b69;
      }
    }
    close_loop(loop);
    eval_a = 0;
    iVar1 = uv_loop_close(loop);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar5 = "uv_loop_close(loop)";
    pcVar4 = "0";
    uVar3 = 0xd4;
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_run(loop, UV_RUN_DEFAULT)";
    uVar3 = 0xcc;
  }
LAB_00173b69:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(we_get_signals) {
  struct signal_ctx sc[4];
  struct timer_ctx tc[2];
  uv_loop_t* loop;
  unsigned int i;

  loop = uv_default_loop();
  start_watcher(loop, SIGUSR1, sc + 0, 0);
  start_watcher(loop, SIGUSR1, sc + 1, 0);
  start_watcher(loop, SIGUSR2, sc + 2, 0);
  start_watcher(loop, SIGUSR2, sc + 3, 0);
  start_timer(loop, SIGUSR1, tc + 0);
  start_timer(loop, SIGUSR2, tc + 1);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  for (i = 0; i < ARRAY_SIZE(sc); i++)
    ASSERT_EQ(sc[i].ncalls, NSIGNALS);

  for (i = 0; i < ARRAY_SIZE(tc); i++)
    ASSERT_EQ(tc[i].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}